

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMocker<void_()>::DescribeDefaultActionTo
          (FunctionMocker<void_()> *this,ArgumentTuple *args,ostream *os)

{
  uint uVar1;
  ostream *poVar2;
  internal *this_00;
  int in_ECX;
  string local_48;
  OnCallSpec<void_()> *local_28;
  OnCallSpec<void_()> *spec;
  ostream *os_local;
  ArgumentTuple *args_local;
  FunctionMocker<void_()> *this_local;
  
  spec = (OnCallSpec<void_()> *)os;
  os_local = (ostream *)args;
  args_local = (ArgumentTuple *)this;
  local_28 = FindOnCallSpec(this,args);
  if (local_28 == (OnCallSpec<void_()> *)0x0) {
    std::operator<<((ostream *)spec,"returning directly.\n");
  }
  else {
    poVar2 = std::operator<<((ostream *)spec,"taking default action specified at:\n");
    this_00 = (internal *)UntypedOnCallSpecBase::file((UntypedOnCallSpecBase *)local_28);
    uVar1 = UntypedOnCallSpecBase::line((UntypedOnCallSpecBase *)local_28);
    FormatFileLocation_abi_cxx11_(&local_48,this_00,(char *)(ulong)uVar1,in_ECX);
    poVar2 = std::operator<<(poVar2,(string *)&local_48);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void DescribeDefaultActionTo(const ArgumentTuple& args,
                               ::std::ostream* os) const {
    const OnCallSpec<F>* const spec = FindOnCallSpec(args);

    if (spec == nullptr) {
      *os << (std::is_void<Result>::value ? "returning directly.\n"
                                          : "returning default value.\n");
    } else {
      *os << "taking default action specified at:\n"
          << FormatFileLocation(spec->file(), spec->line()) << "\n";
    }
  }